

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O1

JL_STATUS OutputBoolObject(JlDataObject *BoolObject,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags
                          ,uint32_t StackDepth)

{
  JL_STATUS JVar1;
  char *Data;
  _Bool boolValue;
  _Bool local_9;
  
  local_9 = false;
  JVar1 = JlGetObjectBool(BoolObject,&local_9);
  if (JVar1 == JL_STATUS_SUCCESS) {
    Data = "false";
    if ((ulong)local_9 != 0) {
      Data = "true";
    }
    JVar1 = JlBufferAdd(JsonBuffer,Data,(ulong)local_9 ^ 5);
  }
  return JVar1;
}

Assistant:

JL_STATUS
    OutputBoolObject
    (
        JlDataObject const*     BoolObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    bool boolValue = false;

    jlStatus = JlGetObjectBool( BoolObject, &boolValue );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        char const* boolStringPtr = boolValue ? "true" : "false";
        jlStatus = JlBufferAdd( JsonBuffer, boolStringPtr, strlen(boolStringPtr) );
    }

    return jlStatus;
}